

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O0

RuleBuilder * __thiscall Potassco::RuleBuilder::clearHead(RuleBuilder *this)

{
  Rule *pRVar1;
  uint *puVar2;
  RuleBuilder *in_RDI;
  Rule *r;
  uint in_stack_ffffffffffffffec;
  RuleBuilder *in_stack_fffffffffffffff0;
  
  pRVar1 = unfreeze(in_stack_fffffffffffffff0,SUB41(in_stack_ffffffffffffffec >> 0x18,0));
  puVar2 = std::max<unsigned_int>(&(pRVar1->body).mend,(uint *)&stack0xffffffffffffffec);
  *(uint *)pRVar1 = *(uint *)pRVar1 & 0x80000000 | *puVar2 & 0x7fffffff;
  Rule::Span::init(&pRVar1->head,(EVP_PKEY_CTX *)0x0);
  return in_RDI;
}

Assistant:

RuleBuilder& RuleBuilder::clearHead() {
	Rule* r = unfreeze(false);
	r->top = std::max(r->body.mend, static_cast<uint32_t>(sizeof(Rule)));
	r->head.init(0, 0);
	return *this;
}